

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

Opnd * __thiscall IR::ListOpnd::CloneUseInternal(ListOpnd *this,Func *func)

{
  JitArenaAllocator *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  ListOpndType *this_02;
  Opnd *this_03;
  RegOpnd *pRVar4;
  ListOpnd *pLVar5;
  ListOpnd *newList;
  ListOpndType *newOpnd;
  int i;
  TrackAllocData local_50;
  ListOpndType **local_28;
  ListOpndType **opnds;
  Func *pFStack_18;
  int count;
  Func *func_local;
  ListOpnd *this_local;
  
  pFStack_18 = func;
  func_local = (Func *)this;
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x963,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  opnds._4_4_ = Count(this);
  this_00 = pFStack_18->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&RegOpnd*::typeinfo,0,(long)opnds._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x965);
  this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_50);
  local_28 = Memory::AllocateArray<Memory::JitArenaAllocator,IR::RegOpnd*,false>
                       ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                        (long)opnds._4_4_);
  for (newOpnd._4_4_ = 0; newOpnd._4_4_ < opnds._4_4_; newOpnd._4_4_ = newOpnd._4_4_ + 1) {
    this_02 = Item(this,newOpnd._4_4_);
    this_03 = Opnd::CloneUse(&this_02->super_Opnd,pFStack_18);
    pRVar4 = Opnd::AsRegOpnd(this_03);
    local_28[newOpnd._4_4_] = pRVar4;
  }
  pLVar5 = New(pFStack_18,local_28,opnds._4_4_);
  Memory::DeleteArray<Memory::JitArenaAllocator,IR::RegOpnd*>
            (pFStack_18->m_alloc,(long)opnds._4_4_,local_28);
  return &pLVar5->super_Opnd;
}

Assistant:

Opnd * ListOpnd::CloneUseInternal(Func * func)
{
    Assert(m_kind == OpndKindList);
    int count = Count();
    ListOpndType** opnds = JitAnewArray(func->m_alloc, ListOpndType*, count);
    for (int i = 0; i < count; ++i)
    {
        ListOpndType* newOpnd = Item(i)->CloneUse(func)->AsRegOpnd();
        opnds[i] = newOpnd;
    }
    ListOpnd* newList = ListOpnd::New(func, opnds, count);
    JitAdeleteArray(func->m_alloc, count, opnds);
    return newList;
}